

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O3

void __thiscall http::Request::Request(Request *this,string *url,InternetProtocol protocol)

{
  string *psVar1;
  string *this_00;
  string *this_01;
  long lVar2;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->internetProtocol = protocol;
  psVar1 = &this->scheme;
  local_38 = &(this->scheme).field_2;
  (this->scheme)._M_dataplus._M_p = (pointer)local_38;
  (this->scheme)._M_string_length = 0;
  (this->scheme).field_2._M_local_buf[0] = '\0';
  this_00 = &this->domain;
  local_40 = &(this->domain).field_2;
  (this->domain)._M_dataplus._M_p = (pointer)local_40;
  (this->domain)._M_string_length = 0;
  (this->domain).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->port).field_2;
  (this->port)._M_dataplus._M_p = (pointer)local_48;
  (this->port)._M_string_length = 0;
  (this->port).field_2._M_local_buf[0] = '\0';
  this_01 = &this->path;
  local_50 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)local_50;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::find((char *)url,0x169763,0);
  local_58 = (string *)psVar1;
  if (lVar2 == -1) {
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->scheme)._M_string_length,0x169767);
    std::__cxx11::string::_M_assign((string *)this_01);
  }
  else {
    std::__cxx11::string::substr((ulong)local_78,(ulong)url);
    std::__cxx11::string::operator=(local_58,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)url);
    std::__cxx11::string::operator=((string *)this_01,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
  }
  lVar2 = std::__cxx11::string::find((char)this_01,0x23);
  if (lVar2 != -1) {
    std::__cxx11::string::resize((ulong)this_01,(char)lVar2);
  }
  lVar2 = std::__cxx11::string::find((char)this_01,0x2f);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)this_00);
    std::__cxx11::string::_M_replace
              ((ulong)this_01,0,(char *)(this->path)._M_string_length,0x16e09b);
  }
  else {
    std::__cxx11::string::substr((ulong)local_78,(ulong)this_01);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)this_01);
    std::__cxx11::string::operator=((string *)this_01,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
  }
  lVar2 = std::__cxx11::string::find((char)this_00,0x3a);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->port,0,(char *)(this->port)._M_string_length,0x16976c);
  }
  else {
    std::__cxx11::string::substr((ulong)local_78,(ulong)this_00);
    std::__cxx11::string::operator=((string *)&this->port,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    std::__cxx11::string::resize((ulong)this_00,(char)lVar2);
  }
  return;
}

Assistant:

explicit Request(const std::string& url,
                         InternetProtocol protocol = InternetProtocol::V4):
            internetProtocol(protocol)
        {
            const auto schemeEndPosition = url.find("://");

            if (schemeEndPosition != std::string::npos)
            {
                scheme = url.substr(0, schemeEndPosition);
                path = url.substr(schemeEndPosition + 3);
            }
            else
            {
                scheme = "http";
                path = url;
            }

            const auto fragmentPosition = path.find('#');

            // remove the fragment part
            if (fragmentPosition != std::string::npos)
                path.resize(fragmentPosition);

            const auto pathPosition = path.find('/');

            if (pathPosition == std::string::npos)
            {
                domain = path;
                path = "/";
            }
            else
            {
                domain = path.substr(0, pathPosition);
                path = path.substr(pathPosition);
            }

            const auto portPosition = domain.find(':');

            if (portPosition != std::string::npos)
            {
                port = domain.substr(portPosition + 1);
                domain.resize(portPosition);
            }
            else
                port = "80";
        }